

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O1

ErrCode __thiscall HttpHeaderBase::removeField(HttpHeaderBase *this,FieldType type)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  HeaderField *pHVar5;
  bool bVar6;
  
  uVar3 = (ulong)this->mNumFields;
  bVar6 = (long)uVar3 < 1;
  if (0 < (long)uVar3) {
    if (this->mFields[0].mType == type) {
      uVar2 = 0;
    }
    else {
      pHVar5 = this->mFields;
      uVar1 = 1;
      do {
        uVar2 = uVar1;
        pHVar5 = pHVar5 + 1;
        if (uVar3 == uVar2) {
          bVar6 = uVar3 <= uVar2;
          goto LAB_001192d7;
        }
        uVar1 = uVar2 + 1;
      } while (pHVar5->mType != type);
      bVar6 = uVar3 <= uVar2;
    }
    uVar4 = this->mNumFields - 1;
    uVar3 = (ulong)uVar4;
    if ((int)uVar2 < (int)uVar4) {
      pHVar5 = this->mFields + uVar2 + 1;
      do {
        uVar2 = uVar2 + 1;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(pHVar5 + -1))->_M_allocated_capacity = *(size_type *)pHVar5;
        *(char **)((long)(pHVar5 + -1) + 8) = pHVar5->mData;
        uVar3 = (long)this->mNumFields - 1;
        pHVar5 = pHVar5 + 1;
      } while ((long)uVar2 < (long)uVar3);
    }
    this->mFields[(int)uVar3].mData = (char *)0x0;
    this->mNumFields = (int)uVar3;
  }
LAB_001192d7:
  return (ErrCode)bVar6;
}

Assistant:

ErrCode HttpHeaderBase::removeField(FieldMap::FieldType type)
{
	TRACE_BEGIN(LOG_LVL_NOISE);

	for (int i = 0; i < mNumFields; i++)
	{
		if (mFields[i].mType == type)
		{
			for (int j = i; j < mNumFields - 1; j++)
			{
				mFields[j] = mFields[j + 1];
			}
			mFields[mNumFields - 1].mData = NULL;
			mNumFields--;
			return JetHead::kNoError;
		}
	}
	return JetHead::kNotFound;
}